

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O1

void console<char[16],unsigned_char,unsigned_char,char[16],unsigned_int,unsigned_int>
               (char *format,char (*args) [16],uchar *args_1,uchar *args_2,char (*args_3) [16],
               uint *args_4,uint *args_5)

{
  if (console_mode != '\0') {
    printf("\x1b[m");
    printf("[CONSOLE] ");
    printf(format,args,(ulong)*args_1,(ulong)*args_2,args_3,(ulong)*args_4,*args_5);
    putchar(10);
    return;
  }
  return;
}

Assistant:

void console(const char *format, Args const & ... args){
    if(console_mode == 0){
        return;
    }
    printf("\e[m");
    printf("[CONSOLE] ");
    printf(format, args ...);
    printf("\n");
}